

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# warp.cpp
# Opt level: O2

void Commands::WarpMeTo(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *arguments,Character *from)

{
  World *pWVar1;
  bool bVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  Character *pCVar6;
  mapped_type *pmVar7;
  WarpAnimation animation;
  string *this;
  allocator<char> local_a1;
  string local_a0;
  string local_80;
  string local_60;
  string local_40;
  
  pWVar1 = from->world;
  std::__cxx11::string::string
            ((string *)&local_40,
             (string *)
             (arguments->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start);
  pCVar6 = World::GetCharacter(pWVar1,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  if ((pCVar6 == (Character *)0x0) || (pCVar6->nowhere == true)) {
    pWVar1 = from->world;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_a0,"character_not_found",&local_a1);
    I18N::Format<>(&local_60,&pWVar1->i18n,&local_a0);
    (*(from->super_Command_Source)._vptr_Command_Source[5])(from,&local_60);
    this = &local_60;
LAB_00122916:
    std::__cxx11::string::~string((string *)this);
    std::__cxx11::string::~string((string *)&local_a0);
  }
  else {
    uVar3 = (**(pCVar6->super_Command_Source)._vptr_Command_Source)(pCVar6);
    pWVar1 = from->world;
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_a0,"cmdprotect",&local_a1);
    pmVar7 = std::__detail::
             _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
             ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                           *)&pWVar1->admin_config,&local_a0);
    iVar4 = util::variant::GetInt(pmVar7);
    if ((int)(uVar3 & 0xff) < iVar4) {
      std::__cxx11::string::~string((string *)&local_a0);
    }
    else {
      iVar4 = (**(pCVar6->super_Command_Source)._vptr_Command_Source)(pCVar6);
      iVar5 = (**(from->super_Command_Source)._vptr_Command_Source)(from);
      std::__cxx11::string::~string((string *)&local_a0);
      if ((byte)iVar5 < (byte)iVar4) {
        pWVar1 = from->world;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_a0,"command_access_denied",&local_a1);
        I18N::Format<>(&local_80,&pWVar1->i18n,&local_a0);
        (*(from->super_Command_Source)._vptr_Command_Source[5])(from,&local_80);
        this = &local_80;
        goto LAB_00122916;
      }
    }
    pWVar1 = from->world;
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_a0,"WarpBubbles",&local_a1);
    pmVar7 = std::__detail::
             _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
             ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                           *)&pWVar1->config,&local_a0);
    bVar2 = util::variant::GetBool(pmVar7);
    if ((bVar2) && ((from->hidden & 0x10) == 0)) {
      animation = (byte)~(byte)pCVar6->hidden >> 3 & WARP_ANIMATION_ADMIN;
    }
    else {
      animation = WARP_ANIMATION_NONE;
    }
    std::__cxx11::string::~string((string *)&local_a0);
    Character::Warp(from,pCVar6->mapid,pCVar6->x,pCVar6->y,animation);
  }
  return;
}

Assistant:

void WarpMeTo(const std::vector<std::string>& arguments, Character* from)
{
	Character *victim = from->world->GetCharacter(arguments[0]);

	if (!victim || victim->nowhere)
	{
		from->ServerMsg(from->world->i18n.Format("character_not_found"));
	}
	else
	{
		if (victim->SourceAccess() < int(from->world->admin_config["cmdprotect"])
		 || victim->SourceAccess() <= from->SourceAccess())
		{
			bool bubbles = from->world->config["WarpBubbles"] && !from->IsHideWarp() && !victim->IsHideWarp();
			from->Warp(victim->mapid, victim->x, victim->y, bubbles ? WARP_ANIMATION_ADMIN : WARP_ANIMATION_NONE);
		}
		else
		{
			from->ServerMsg(from->world->i18n.Format("command_access_denied"));
		}
	}
}